

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

int testStateFeatureDescriptionInInputs(void)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  int iVar1;
  Rep *pRVar2;
  ModelDescription *interface;
  bool bVar3;
  FeatureDescription *pFVar4;
  ostream *poVar5;
  Arena *arena;
  ValidationPolicy validationPolicy;
  Model m;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ValidationPolicy local_54;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50,(Arena *)0x0,false);
  if (local_50.description_ == (ModelDescription *)0x0) {
    arena = (Arena *)(local_50.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_50.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena = *(Arena **)arena;
    }
    local_50.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>(arena)
    ;
  }
  interface = local_50.description_;
  pRVar2 = ((local_50.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = ((local_50.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      ((local_50.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pFVar4 = (FeatureDescription *)pRVar2->elements[iVar1];
      goto LAB_001440a0;
    }
  }
  this = &(local_50.description_)->input_;
  pFVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                     ((this->super_RepeatedPtrFieldBase).arena_);
  pFVar4 = (FeatureDescription *)
           google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&this->super_RepeatedPtrFieldBase,pFVar4);
LAB_001440a0:
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"x","");
  setupStateFeature(pFVar4,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_54.allowsEmptyInput = true;
  local_54.allowsEmptyOutput = true;
  local_54.allowsMultipleFunctions = true;
  local_54.allowsStatefulPrediction = true;
  CoreML::validateModelDescription((Result *)local_80,interface,9,&local_54);
  bVar3 = CoreML::Result::good((Result *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1a6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).good()"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)!bVar3;
}

Assistant:

int testStateFeatureDescriptionInInputs() {
    Specification::Model m;
    auto *description = m.mutable_description();

    setupStateFeature(description->add_input(), "x");

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy));

    return 0;
}